

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olsrv2_routing.c
# Opt level: O1

void olsrv2_routing_cleanup(void)

{
  list_entity *plVar1;
  list_entity *plVar2;
  list_entity *plVar3;
  long lVar4;
  
  nhdp_domain_listener_remove(&_nhdp_listener);
  oonf_timer_stop(&_rate_limit_timer);
  lVar4 = 0;
  do {
    plVar3 = _routing_tree[lVar4].list_head.next;
    if (plVar3->prev != _routing_tree[lVar4].list_head.prev) {
      do {
        plVar1 = plVar3->next;
        _remove_entry((olsrv2_routing_entry *)&plVar3[-0x17].prev);
        plVar3 = plVar1;
      } while (plVar1->prev != _routing_tree[lVar4].list_head.prev);
    }
    lVar4 = lVar4 + 1;
  } while (lVar4 != 4);
  plVar3 = _routing_filter_list.next;
  if ((_routing_filter_list.next)->prev != _routing_filter_list.prev) {
    do {
      plVar1 = plVar3->next;
      plVar2 = plVar3->prev;
      plVar2->next = plVar1;
      plVar1->prev = plVar2;
      plVar3->next = (list_entity *)0x0;
      plVar3->prev = (list_entity *)0x0;
      plVar3 = plVar1;
    } while (plVar1->prev != _routing_filter_list.prev);
  }
  oonf_timer_remove(&_dijkstra_timer_info);
  oonf_class_remove(&_rtset_entry);
  return;
}

Assistant:

void
olsrv2_routing_cleanup(void) {
  struct olsrv2_routing_entry *entry, *e_it;
  struct olsrv2_routing_filter *filter, *f_it;
  int i;

  nhdp_domain_listener_remove(&_nhdp_listener);
  oonf_timer_stop(&_rate_limit_timer);

  for (i = 0; i < NHDP_MAXIMUM_DOMAINS; i++) {
    avl_for_each_element_safe(&_routing_tree[i], entry, _node, e_it) {
      /* remove entry from database */
      _remove_entry(entry);
    }
  }

  list_for_each_element_safe(&_routing_filter_list, filter, _node, f_it) {
    olsrv2_routing_filter_remove(filter);
  }

  oonf_timer_remove(&_dijkstra_timer_info);
  oonf_class_remove(&_rtset_entry);
}